

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar17;
  byte bVar18;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar19) [32];
  long lVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  size_t sVar38;
  ulong uVar39;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar80;
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  long lStack_26f0;
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<8>_> *local_26c8;
  undefined1 local_2688 [16];
  ulong local_2670;
  long local_2668;
  ulong local_2660;
  long local_2658;
  Scene *local_2650;
  RTCFilterFunctionNArguments args;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined1 local_2608 [16];
  undefined1 local_25f8 [16];
  undefined1 local_25e8 [16];
  UVIdentity<4> *local_25d8;
  byte local_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  float local_2578 [4];
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [32];
  undefined1 local_2508 [32];
  undefined1 local_24e8 [32];
  undefined1 local_24c8 [16];
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  RTCHitN local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined1 local_2418 [32];
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_26c8 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_24e8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar113 = ZEXT3264(local_24e8);
  local_2508 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar114 = ZEXT3264(local_2508);
  local_2528 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar115 = ZEXT3264(local_2528);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2548 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar89 * 0.99999964)));
  auVar116 = ZEXT3264(local_2548);
  local_2568 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar96 * 0.99999964)));
  auVar117 = ZEXT3264(local_2568);
  fVar81 = fVar103 * 0.99999964;
  fVar89 = fVar89 * 1.0000004;
  fVar96 = fVar96 * 1.0000004;
  fVar103 = fVar103 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = uVar25 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_2418._4_4_ = iVar2;
  local_2418._0_4_ = iVar2;
  local_2418._8_4_ = iVar2;
  local_2418._12_4_ = iVar2;
  local_2418._16_4_ = iVar2;
  local_2418._20_4_ = iVar2;
  local_2418._24_4_ = iVar2;
  local_2418._28_4_ = iVar2;
  auVar110 = ZEXT3264(local_2418);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar73 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_24c8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar64 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar111 = ZEXT3264(auVar64);
  auVar64 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar112 = ZEXT3264(auVar64);
  local_2398 = fVar81;
  fStack_2394 = fVar81;
  fStack_2390 = fVar81;
  fStack_238c = fVar81;
  fStack_2388 = fVar81;
  fStack_2384 = fVar81;
  fStack_2380 = fVar81;
  fStack_237c = fVar81;
  local_23b8 = fVar89;
  fStack_23b4 = fVar89;
  fStack_23b0 = fVar89;
  fStack_23ac = fVar89;
  fStack_23a8 = fVar89;
  fStack_23a4 = fVar89;
  fStack_23a0 = fVar89;
  fStack_239c = fVar89;
  local_23d8 = fVar96;
  fStack_23d4 = fVar96;
  fStack_23d0 = fVar96;
  fStack_23cc = fVar96;
  fStack_23c8 = fVar96;
  fStack_23c4 = fVar96;
  fStack_23c0 = fVar96;
  fStack_23bc = fVar96;
  local_23f8 = fVar103;
  fStack_23f4 = fVar103;
  fStack_23f0 = fVar103;
  fStack_23ec = fVar103;
  fStack_23e8 = fVar103;
  fStack_23e4 = fVar103;
  fStack_23e0 = fVar103;
  fStack_23dc = fVar103;
  fVar83 = fVar81;
  fVar84 = fVar81;
  fVar85 = fVar81;
  fVar86 = fVar81;
  fVar87 = fVar81;
  fVar88 = fVar81;
  fVar90 = fVar89;
  fVar91 = fVar89;
  fVar92 = fVar89;
  fVar93 = fVar89;
  fVar94 = fVar89;
  fVar95 = fVar89;
  fVar97 = fVar96;
  fVar98 = fVar96;
  fVar99 = fVar96;
  fVar100 = fVar96;
  fVar101 = fVar96;
  fVar102 = fVar96;
  fVar104 = fVar103;
  fVar105 = fVar103;
  fVar106 = fVar103;
  fVar107 = fVar103;
  fVar108 = fVar103;
  fVar109 = fVar103;
  local_2670 = uVar25;
LAB_01da1bb4:
  do {
    if (local_26c8 == stack) {
      return;
    }
    pSVar17 = local_26c8 + -1;
    local_26c8 = local_26c8 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar17->dist);
  sVar38 = (local_26c8->ptr).ptr;
LAB_01da1be3:
  do {
    if ((sVar38 & 8) != 0) break;
    pauVar19 = (undefined1 (*) [32])(sVar38 & 0xfffffffffffffff0);
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x70);
    auVar69._4_4_ = uVar80;
    auVar69._0_4_ = uVar80;
    auVar69._8_4_ = uVar80;
    auVar69._12_4_ = uVar80;
    auVar69._16_4_ = uVar80;
    auVar69._20_4_ = uVar80;
    auVar69._24_4_ = uVar80;
    auVar69._28_4_ = uVar80;
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar25),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + uVar25));
    auVar64 = vsubps_avx512vl(ZEXT1632(auVar63),auVar113._0_32_);
    auVar64 = vmulps_avx512vl(auVar116._0_32_,auVar64);
    auVar64 = vmaxps_avx(auVar110._0_32_,auVar64);
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar27),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + uVar27));
    auVar65 = vsubps_avx512vl(ZEXT1632(auVar63),auVar114._0_32_);
    auVar66 = vmulps_avx512vl(auVar117._0_32_,auVar65);
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar39),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + uVar39));
    auVar67 = vsubps_avx512vl(ZEXT1632(auVar63),auVar115._0_32_);
    auVar65._4_4_ = fVar83 * auVar67._4_4_;
    auVar65._0_4_ = fVar81 * auVar67._0_4_;
    auVar65._8_4_ = fVar84 * auVar67._8_4_;
    auVar65._12_4_ = fVar85 * auVar67._12_4_;
    auVar65._16_4_ = fVar86 * auVar67._16_4_;
    auVar65._20_4_ = fVar87 * auVar67._20_4_;
    auVar65._24_4_ = fVar88 * auVar67._24_4_;
    auVar65._28_4_ = auVar67._28_4_;
    auVar65 = vmaxps_avx(auVar66,auVar65);
    auVar64 = vmaxps_avx(auVar64,auVar65);
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar28),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + uVar28));
    auVar65 = vsubps_avx512vl(ZEXT1632(auVar63),auVar113._0_32_);
    auVar66._4_4_ = fVar90 * auVar65._4_4_;
    auVar66._0_4_ = fVar89 * auVar65._0_4_;
    auVar66._8_4_ = fVar91 * auVar65._8_4_;
    auVar66._12_4_ = fVar92 * auVar65._12_4_;
    auVar66._16_4_ = fVar93 * auVar65._16_4_;
    auVar66._20_4_ = fVar94 * auVar65._20_4_;
    auVar66._24_4_ = fVar95 * auVar65._24_4_;
    auVar66._28_4_ = auVar65._28_4_;
    auVar65 = vminps_avx(auVar73._0_32_,auVar66);
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + (uVar27 ^ 0x20)),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + (uVar27 ^ 0x20)));
    auVar66 = vsubps_avx512vl(ZEXT1632(auVar63),auVar114._0_32_);
    auVar67._4_4_ = fVar97 * auVar66._4_4_;
    auVar67._0_4_ = fVar96 * auVar66._0_4_;
    auVar67._8_4_ = fVar98 * auVar66._8_4_;
    auVar67._12_4_ = fVar99 * auVar66._12_4_;
    auVar67._16_4_ = fVar100 * auVar66._16_4_;
    auVar67._20_4_ = fVar101 * auVar66._20_4_;
    auVar67._24_4_ = fVar102 * auVar66._24_4_;
    auVar67._28_4_ = auVar66._28_4_;
    auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + (uVar39 ^ 0x20)),auVar69,
                              *(undefined1 (*) [32])(pauVar19[2] + (uVar39 ^ 0x20)));
    auVar66 = vsubps_avx512vl(ZEXT1632(auVar63),auVar115._0_32_);
    auVar68._4_4_ = fVar104 * auVar66._4_4_;
    auVar68._0_4_ = fVar103 * auVar66._0_4_;
    auVar68._8_4_ = fVar105 * auVar66._8_4_;
    auVar68._12_4_ = fVar106 * auVar66._12_4_;
    auVar68._16_4_ = fVar107 * auVar66._16_4_;
    auVar68._20_4_ = fVar108 * auVar66._20_4_;
    auVar68._24_4_ = fVar109 * auVar66._24_4_;
    auVar68._28_4_ = auVar66._28_4_;
    auVar66 = vminps_avx(auVar67,auVar68);
    auVar65 = vminps_avx(auVar65,auVar66);
    uVar41 = vcmpps_avx512vl(auVar64,auVar65,2);
    if (((uint)sVar38 & 7) == 6) {
      uVar29 = vcmpps_avx512vl(auVar69,pauVar19[0xe],0xd);
      uVar30 = vcmpps_avx512vl(auVar69,pauVar19[0xf],1);
      uVar41 = uVar41 & uVar29 & uVar30;
    }
    bVar18 = (byte)uVar41;
    if (bVar18 == 0) goto LAB_01da1bb4;
    auVar65 = *pauVar19;
    auVar66 = pauVar19[1];
    auVar67 = vpternlogd_avx512vl(auVar111._0_32_,auVar64,auVar112._0_32_,0xf8);
    auVar68 = vpcompressd_avx512vl(auVar67);
    auVar71._0_4_ = (uint)(bVar18 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar67._0_4_;
    bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
    auVar71._4_4_ = (uint)bVar40 * auVar68._4_4_ | (uint)!bVar40 * auVar67._4_4_;
    bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
    auVar71._8_4_ = (uint)bVar40 * auVar68._8_4_ | (uint)!bVar40 * auVar67._8_4_;
    bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
    auVar71._12_4_ = (uint)bVar40 * auVar68._12_4_ | (uint)!bVar40 * auVar67._12_4_;
    bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
    auVar71._16_4_ = (uint)bVar40 * auVar68._16_4_ | (uint)!bVar40 * auVar67._16_4_;
    bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
    auVar71._20_4_ = (uint)bVar40 * auVar68._20_4_ | (uint)!bVar40 * auVar67._20_4_;
    bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
    auVar71._24_4_ = (uint)bVar40 * auVar68._24_4_ | (uint)!bVar40 * auVar67._24_4_;
    bVar40 = SUB81(uVar41 >> 7,0);
    auVar71._28_4_ = (uint)bVar40 * auVar68._28_4_ | (uint)!bVar40 * auVar67._28_4_;
    auVar67 = vpermt2q_avx512vl(auVar65,auVar71,auVar66);
    sVar38 = auVar67._0_8_;
    bVar18 = bVar18 - 1 & bVar18;
    if (bVar18 != 0) {
      auVar67 = vpshufd_avx2(auVar71,0x55);
      vpermt2q_avx512vl(auVar65,auVar67,auVar66);
      auVar68 = vpminsd_avx2(auVar71,auVar67);
      auVar67 = vpmaxsd_avx2(auVar71,auVar67);
      bVar18 = bVar18 - 1 & bVar18;
      if (bVar18 == 0) {
        auVar68 = vpermi2q_avx512vl(auVar68,auVar65,auVar66);
        sVar38 = auVar68._0_8_;
        auVar65 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
        (local_26c8->ptr).ptr = auVar65._0_8_;
        lVar20 = 8;
        lStack_26f0 = 0x10;
      }
      else {
        auVar77 = vpshufd_avx2(auVar71,0xaa);
        vpermt2q_avx512vl(auVar65,auVar77,auVar66);
        auVar69 = vpminsd_avx2(auVar68,auVar77);
        auVar68 = vpmaxsd_avx2(auVar68,auVar77);
        auVar77 = vpminsd_avx2(auVar67,auVar68);
        auVar68 = vpmaxsd_avx2(auVar67,auVar68);
        bVar18 = bVar18 - 1 & bVar18;
        if (bVar18 == 0) {
          auVar67 = vpermi2q_avx512vl(auVar69,auVar65,auVar66);
          sVar38 = auVar67._0_8_;
          auVar67 = vpermt2q_avx512vl(auVar65,auVar68,auVar66);
          (local_26c8->ptr).ptr = auVar67._0_8_;
          auVar67 = vpermd_avx2(auVar68,auVar64);
          local_26c8->dist = auVar67._0_4_;
          auVar65 = vpermt2q_avx512vl(auVar65,auVar77,auVar66);
          local_26c8[1].ptr.ptr = auVar65._0_8_;
          lStack_26f0 = 0x18;
          lVar20 = lStack_26f0;
          lStack_26f0 = 0x20;
          auVar67 = auVar77;
        }
        else {
          auVar67 = vpshufd_avx2(auVar71,0xff);
          vpermt2q_avx512vl(auVar65,auVar67,auVar66);
          auVar11 = vpminsd_avx2(auVar69,auVar67);
          auVar69 = vpmaxsd_avx2(auVar69,auVar67);
          auVar67 = vpminsd_avx2(auVar77,auVar69);
          auVar69 = vpmaxsd_avx2(auVar77,auVar69);
          auVar77 = vpminsd_avx2(auVar68,auVar69);
          auVar68 = vpmaxsd_avx2(auVar68,auVar69);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 != 0) {
            auVar70 = valignd_avx512vl(auVar71,auVar71,3);
            auVar69 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar71 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar69,auVar11);
            auVar69 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar67 = vpermt2d_avx512vl(auVar71,auVar69,auVar67);
            auVar69 = vpermt2d_avx512vl(auVar67,auVar69,auVar77);
            auVar67 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar67 = vpermt2d_avx512vl(auVar69,auVar67,auVar68);
            auVar113 = ZEXT3264(auVar67);
            bVar22 = bVar18;
            do {
              auVar68 = auVar113._0_32_;
              auVar77._8_4_ = 1;
              auVar77._0_8_ = 0x100000001;
              auVar77._12_4_ = 1;
              auVar77._16_4_ = 1;
              auVar77._20_4_ = 1;
              auVar77._24_4_ = 1;
              auVar77._28_4_ = 1;
              auVar67 = vpermd_avx2(auVar77,auVar70);
              auVar70 = valignd_avx512vl(auVar70,auVar70,1);
              vpermt2q_avx512vl(auVar65,auVar70,auVar66);
              bVar22 = bVar22 - 1 & bVar22;
              uVar13 = vpcmpd_avx512vl(auVar67,auVar68,5);
              auVar67 = vpmaxsd_avx2(auVar67,auVar68);
              bVar21 = (byte)uVar13 << 1;
              auVar68 = valignd_avx512vl(auVar68,auVar68,7);
              bVar40 = (bool)((byte)uVar13 & 1);
              bVar6 = (bool)(bVar21 >> 2 & 1);
              bVar7 = (bool)(bVar21 >> 3 & 1);
              bVar8 = (bool)(bVar21 >> 4 & 1);
              bVar9 = (bool)(bVar21 >> 5 & 1);
              bVar10 = (bool)(bVar21 >> 6 & 1);
              auVar113 = ZEXT3264(CONCAT428((uint)(bVar21 >> 7) * auVar68._28_4_ |
                                            (uint)!(bool)(bVar21 >> 7) * auVar67._28_4_,
                                            CONCAT424((uint)bVar10 * auVar68._24_4_ |
                                                      (uint)!bVar10 * auVar67._24_4_,
                                                      CONCAT420((uint)bVar9 * auVar68._20_4_ |
                                                                (uint)!bVar9 * auVar67._20_4_,
                                                                CONCAT416((uint)bVar8 *
                                                                          auVar68._16_4_ |
                                                                          (uint)!bVar8 *
                                                                          auVar67._16_4_,
                                                                          CONCAT412((uint)bVar7 *
                                                                                    auVar68._12_4_ |
                                                                                    (uint)!bVar7 *
                                                                                    auVar67._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar6 * auVar68._8_4_ |
                                                  (uint)!bVar6 * auVar67._8_4_,
                                                  CONCAT44((uint)bVar40 * auVar68._4_4_ |
                                                           (uint)!bVar40 * auVar67._4_4_,
                                                           auVar67._0_4_))))))));
            } while (bVar22 != 0);
            lVar20 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
            while( true ) {
              auVar68 = auVar113._0_32_;
              auVar67 = vpermt2q_avx512vl(auVar65,auVar68,auVar66);
              sVar38 = auVar67._0_8_;
              bVar40 = lVar20 == 0;
              lVar20 = lVar20 + -1;
              if (bVar40) break;
              (local_26c8->ptr).ptr = sVar38;
              auVar67 = vpermd_avx2(auVar68,auVar64);
              local_26c8->dist = auVar67._0_4_;
              auVar67 = valignd_avx512vl(auVar68,auVar68,1);
              auVar113 = ZEXT3264(auVar67);
              local_26c8 = local_26c8 + 1;
            }
            auVar113 = ZEXT3264(local_24e8);
            auVar114 = ZEXT3264(local_2508);
            auVar115 = ZEXT3264(local_2528);
            auVar116 = ZEXT3264(local_2548);
            auVar117 = ZEXT3264(local_2568);
            goto LAB_01da1be3;
          }
          auVar69 = vpermi2q_avx512vl(auVar11,auVar65,auVar66);
          sVar38 = auVar69._0_8_;
          auVar69 = vpermt2q_avx512vl(auVar65,auVar68,auVar66);
          (local_26c8->ptr).ptr = auVar69._0_8_;
          auVar68 = vpermd_avx2(auVar68,auVar64);
          local_26c8->dist = auVar68._0_4_;
          auVar68 = vpermt2q_avx512vl(auVar65,auVar77,auVar66);
          local_26c8[1].ptr.ptr = auVar68._0_8_;
          auVar68 = vpermd_avx2(auVar77,auVar64);
          local_26c8[1].dist = auVar68._0_4_;
          auVar65 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
          local_26c8[2].ptr.ptr = auVar65._0_8_;
          lVar20 = 0x28;
          lStack_26f0 = 0x30;
        }
      }
      auVar64 = vpermd_avx2(auVar67,auVar64);
      *(int *)((long)&(local_26c8->ptr).ptr + lVar20) = auVar64._0_4_;
      local_26c8 = (StackItemT<embree::NodeRefPtr<8>_> *)
                   ((long)&(local_26c8->ptr).ptr + lStack_26f0);
    }
  } while( true );
  local_2668 = (ulong)((uint)sVar38 & 0xf) - 8;
  uVar41 = sVar38 & 0xfffffffffffffff0;
  for (local_2658 = 0; local_2658 != local_2668; local_2658 = local_2658 + 1) {
    lVar26 = local_2658 * 0x50;
    local_2650 = context->scene;
    pGVar4 = (local_2650->geometries).items[*(uint *)(uVar41 + 0x30 + lVar26)].ptr;
    fVar89 = (pGVar4->time_range).lower;
    fVar89 = pGVar4->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x70) - fVar89) / ((pGVar4->time_range).upper - fVar89));
    auVar63 = vroundss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),9);
    auVar63 = vminss_avx(auVar63,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
    auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar63);
    lVar24 = (long)(int)auVar76._0_4_ * 0x38;
    uVar32 = (ulong)*(uint *)(uVar41 + 4 + lVar26);
    lVar20 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar24);
    lVar24 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar24);
    auVar63 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar41 + lVar26) * 4);
    uVar25 = (ulong)*(uint *)(uVar41 + 0x10 + lVar26);
    auVar59 = *(undefined1 (*) [16])(lVar20 + uVar25 * 4);
    uVar29 = (ulong)*(uint *)(uVar41 + 0x20 + lVar26);
    auVar57 = *(undefined1 (*) [16])(lVar20 + uVar29 * 4);
    auVar42 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
    uVar30 = (ulong)*(uint *)(uVar41 + 0x14 + lVar26);
    auVar56 = *(undefined1 (*) [16])(lVar20 + uVar30 * 4);
    local_2660 = (ulong)*(uint *)(uVar41 + 0x24 + lVar26);
    auVar58 = *(undefined1 (*) [16])(lVar20 + local_2660 * 4);
    uVar37 = (ulong)*(uint *)(uVar41 + 8 + lVar26);
    auVar43 = *(undefined1 (*) [16])(lVar20 + uVar37 * 4);
    uVar36 = (ulong)*(uint *)(uVar41 + 0x18 + lVar26);
    auVar45 = *(undefined1 (*) [16])(lVar20 + uVar36 * 4);
    uVar35 = (ulong)*(uint *)(uVar41 + 0x28 + lVar26);
    auVar55 = *(undefined1 (*) [16])(lVar20 + uVar35 * 4);
    uVar34 = (ulong)*(uint *)(uVar41 + 0xc + lVar26);
    auVar53 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
    uVar33 = (ulong)*(uint *)(uVar41 + 0x1c + lVar26);
    auVar54 = *(undefined1 (*) [16])(lVar20 + uVar33 * 4);
    uVar31 = (ulong)*(uint *)(uVar41 + 0x2c + lVar26);
    auVar44 = *(undefined1 (*) [16])(lVar20 + uVar31 * 4);
    auVar46 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar41 + lVar26) * 4);
    auVar47 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
    auVar50 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
    auVar48 = *(undefined1 (*) [16])(lVar24 + uVar32 * 4);
    auVar49 = *(undefined1 (*) [16])(lVar24 + uVar30 * 4);
    auVar51 = *(undefined1 (*) [16])(lVar24 + local_2660 * 4);
    auVar52 = *(undefined1 (*) [16])(lVar24 + uVar37 * 4);
    auVar60 = *(undefined1 (*) [16])(lVar24 + uVar36 * 4);
    auVar61 = *(undefined1 (*) [16])(lVar24 + uVar35 * 4);
    auVar62 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
    auVar74 = *(undefined1 (*) [16])(lVar24 + uVar33 * 4);
    auVar75 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
    puVar1 = (undefined8 *)(uVar41 + 0x30 + lVar26);
    local_24b8 = *puVar1;
    uStack_24b0 = puVar1[1];
    puVar1 = (undefined8 *)(uVar41 + 0x40 + lVar26);
    auVar78 = vunpcklps_avx(auVar63,auVar43);
    auVar63 = vunpckhps_avx(auVar63,auVar43);
    auVar43 = vunpcklps_avx(auVar42,auVar53);
    auVar42 = vunpckhps_avx(auVar42,auVar53);
    auVar53 = vunpcklps_avx(auVar63,auVar42);
    auVar79 = vunpcklps_avx(auVar78,auVar43);
    auVar63 = vunpckhps_avx(auVar78,auVar43);
    auVar43 = vunpcklps_avx(auVar59,auVar45);
    auVar59 = vunpckhps_avx(auVar59,auVar45);
    auVar45 = vunpcklps_avx(auVar56,auVar54);
    auVar42 = vunpckhps_avx(auVar56,auVar54);
    auVar56 = vunpcklps_avx(auVar59,auVar42);
    auVar54 = vunpcklps_avx(auVar43,auVar45);
    auVar59 = vunpckhps_avx(auVar43,auVar45);
    auVar43 = vunpcklps_avx(auVar57,auVar55);
    auVar57 = vunpckhps_avx(auVar57,auVar55);
    auVar45 = vunpcklps_avx(auVar58,auVar44);
    auVar42 = vunpckhps_avx(auVar58,auVar44);
    auVar58 = vunpcklps_avx(auVar57,auVar42);
    auVar55 = vunpcklps_avx(auVar43,auVar45);
    auVar57 = vunpckhps_avx(auVar43,auVar45);
    auVar42 = vunpcklps_avx512vl(auVar46,auVar52);
    auVar43 = vunpckhps_avx512vl(auVar46,auVar52);
    auVar44 = vunpcklps_avx512vl(auVar48,auVar62);
    auVar45 = vunpckhps_avx512vl(auVar48,auVar62);
    auVar43 = vunpcklps_avx(auVar43,auVar45);
    auVar45 = vunpcklps_avx(auVar42,auVar44);
    auVar42 = vunpckhps_avx(auVar42,auVar44);
    auVar44 = vunpcklps_avx512vl(auVar47,auVar60);
    auVar46 = vunpckhps_avx512vl(auVar47,auVar60);
    auVar47 = vunpcklps_avx512vl(auVar49,auVar74);
    auVar48 = vunpckhps_avx512vl(auVar49,auVar74);
    auVar46 = vunpcklps_avx512vl(auVar46,auVar48);
    auVar48 = vunpcklps_avx512vl(auVar44,auVar47);
    auVar47 = vunpckhps_avx512vl(auVar44,auVar47);
    auVar49 = vunpcklps_avx512vl(auVar50,auVar61);
    auVar44 = vunpckhps_avx512vl(auVar50,auVar61);
    auVar50 = vunpcklps_avx512vl(auVar51,auVar75);
    auVar51 = vunpckhps_avx512vl(auVar51,auVar75);
    auVar44 = vunpcklps_avx(auVar44,auVar51);
    auVar51 = vunpcklps_avx512vl(auVar49,auVar50);
    auVar50 = vunpckhps_avx512vl(auVar49,auVar50);
    auVar52 = ZEXT416((uint)(fVar89 - auVar76._0_4_));
    auVar49 = vbroadcastss_avx512vl(auVar52);
    auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
    auVar60._0_4_ = auVar52._0_4_;
    auVar60._4_4_ = auVar60._0_4_;
    auVar60._8_4_ = auVar60._0_4_;
    auVar60._12_4_ = auVar60._0_4_;
    auVar45 = vmulps_avx512vl(auVar49,auVar45);
    auVar52 = vmulps_avx512vl(auVar49,auVar42);
    auVar43 = vmulps_avx512vl(auVar49,auVar43);
    auVar42 = vfmadd231ps_fma(auVar45,auVar60,auVar79);
    auVar52 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar63);
    auVar63 = vfmadd231ps_fma(auVar43,auVar60,auVar53);
    auVar43 = vmulps_avx512vl(auVar49,auVar48);
    auVar45 = vmulps_avx512vl(auVar49,auVar47);
    auVar53 = vmulps_avx512vl(auVar49,auVar46);
    auVar43 = vfmadd231ps_fma(auVar43,auVar60,auVar54);
    auVar59 = vfmadd231ps_fma(auVar45,auVar60,auVar59);
    auVar56 = vfmadd231ps_fma(auVar53,auVar60,auVar56);
    auVar45 = vmulps_avx512vl(auVar49,auVar51);
    auVar53 = vmulps_avx512vl(auVar49,auVar50);
    auVar54 = vmulps_avx512vl(auVar49,auVar44);
    auVar45 = vfmadd231ps_fma(auVar45,auVar60,auVar55);
    auVar57 = vfmadd231ps_fma(auVar53,auVar60,auVar57);
    local_2618 = *puVar1;
    uStack_2610 = puVar1[1];
    auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4)));
    auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
    auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar78._4_4_ = uVar80;
    auVar78._0_4_ = uVar80;
    auVar78._8_4_ = uVar80;
    auVar78._12_4_ = uVar80;
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar79._4_4_ = uVar80;
    auVar79._0_4_ = uVar80;
    auVar79._8_4_ = uVar80;
    auVar79._12_4_ = uVar80;
    auVar58 = vfmadd231ps_fma(auVar54,auVar60,auVar58);
    fVar89 = *(float *)(ray + k * 4 + 0x60);
    auVar82._4_4_ = fVar89;
    auVar82._0_4_ = fVar89;
    auVar82._8_4_ = fVar89;
    auVar82._12_4_ = fVar89;
    auVar42 = vsubps_avx512vl(auVar42,auVar55);
    auVar54 = vsubps_avx512vl(auVar52,auVar53);
    auVar46 = vsubps_avx512vl(auVar63,auVar44);
    auVar43 = vsubps_avx512vl(auVar43,auVar55);
    auVar47 = vsubps_avx512vl(auVar59,auVar53);
    auVar56 = vsubps_avx512vl(auVar56,auVar44);
    auVar45 = vsubps_avx512vl(auVar45,auVar55);
    auVar57 = vsubps_avx512vl(auVar57,auVar53);
    auVar58 = vsubps_avx512vl(auVar58,auVar44);
    auVar55 = vsubps_avx512vl(auVar45,auVar42);
    auVar53 = vsubps_avx512vl(auVar57,auVar54);
    auVar63 = vsubps_avx(auVar58,auVar46);
    auVar44 = vsubps_avx512vl(auVar42,auVar43);
    auVar50 = vsubps_avx512vl(auVar54,auVar47);
    auVar48 = vsubps_avx512vl(auVar46,auVar56);
    auVar49 = vsubps_avx512vl(auVar43,auVar45);
    auVar51 = vsubps_avx512vl(auVar47,auVar57);
    auVar52 = vsubps_avx512vl(auVar56,auVar58);
    auVar59 = vaddps_avx512vl(auVar45,auVar42);
    auVar60 = vaddps_avx512vl(auVar57,auVar54);
    auVar61 = vaddps_avx512vl(auVar58,auVar46);
    auVar62 = vmulps_avx512vl(auVar60,auVar63);
    auVar62 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar61);
    auVar61 = vmulps_avx512vl(auVar61,auVar55);
    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar63,auVar59);
    auVar74._0_4_ = auVar53._0_4_ * auVar59._0_4_;
    auVar74._4_4_ = auVar53._4_4_ * auVar59._4_4_;
    auVar74._8_4_ = auVar53._8_4_ * auVar59._8_4_;
    auVar74._12_4_ = auVar53._12_4_ * auVar59._12_4_;
    auVar59 = vfmsub231ps_fma(auVar74,auVar55,auVar60);
    auVar75._0_4_ = fVar89 * auVar59._0_4_;
    auVar75._4_4_ = fVar89 * auVar59._4_4_;
    auVar75._8_4_ = fVar89 * auVar59._8_4_;
    auVar75._12_4_ = fVar89 * auVar59._12_4_;
    auVar59 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar61);
    local_2608 = vfmadd231ps_avx512vl(auVar59,auVar78,auVar62);
    auVar62._0_4_ = auVar43._0_4_ + auVar42._0_4_;
    auVar62._4_4_ = auVar43._4_4_ + auVar42._4_4_;
    auVar62._8_4_ = auVar43._8_4_ + auVar42._8_4_;
    auVar62._12_4_ = auVar43._12_4_ + auVar42._12_4_;
    auVar59 = vaddps_avx512vl(auVar54,auVar47);
    auVar60 = vaddps_avx512vl(auVar46,auVar56);
    auVar61 = vmulps_avx512vl(auVar59,auVar48);
    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar50,auVar60);
    auVar60 = vmulps_avx512vl(auVar60,auVar44);
    auVar60 = vfmsub231ps_avx512vl(auVar60,auVar48,auVar62);
    auVar62 = vmulps_avx512vl(auVar62,auVar50);
    auVar59 = vfmsub231ps_avx512vl(auVar62,auVar44,auVar59);
    auVar76._0_4_ = fVar89 * auVar59._0_4_;
    auVar76._4_4_ = fVar89 * auVar59._4_4_;
    auVar76._8_4_ = fVar89 * auVar59._8_4_;
    auVar76._12_4_ = fVar89 * auVar59._12_4_;
    auVar59 = vfmadd231ps_avx512vl(auVar76,auVar79,auVar60);
    local_25f8 = vfmadd231ps_avx512vl(auVar59,auVar78,auVar61);
    auVar43 = vaddps_avx512vl(auVar43,auVar45);
    auVar57 = vaddps_avx512vl(auVar47,auVar57);
    auVar59 = vaddps_avx512vl(auVar56,auVar58);
    auVar56 = vmulps_avx512vl(auVar57,auVar52);
    auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar59);
    auVar58._0_4_ = auVar59._0_4_ * auVar49._0_4_;
    auVar58._4_4_ = auVar59._4_4_ * auVar49._4_4_;
    auVar58._8_4_ = auVar59._8_4_ * auVar49._8_4_;
    auVar58._12_4_ = auVar59._12_4_ * auVar49._12_4_;
    auVar59 = vfmsub231ps_fma(auVar58,auVar52,auVar43);
    auVar45._0_4_ = auVar43._0_4_ * auVar51._0_4_;
    auVar45._4_4_ = auVar43._4_4_ * auVar51._4_4_;
    auVar45._8_4_ = auVar43._8_4_ * auVar51._8_4_;
    auVar45._12_4_ = auVar43._12_4_ * auVar51._12_4_;
    auVar57 = vfmsub231ps_avx512vl(auVar45,auVar49,auVar57);
    auVar57 = vmulps_avx512vl(auVar57,auVar82);
    auVar59 = vfmadd231ps_avx512vl(auVar57,auVar79,auVar59);
    auVar56 = vfmadd231ps_avx512vl(auVar59,auVar78,auVar56);
    auVar43._0_4_ = local_2608._0_4_ + local_25f8._0_4_;
    auVar43._4_4_ = local_2608._4_4_ + local_25f8._4_4_;
    auVar43._8_4_ = local_2608._8_4_ + local_25f8._8_4_;
    auVar43._12_4_ = local_2608._12_4_ + local_25f8._12_4_;
    local_25e8 = vaddps_avx512vl(auVar56,auVar43);
    auVar59._8_4_ = 0x7fffffff;
    auVar59._0_8_ = 0x7fffffff7fffffff;
    auVar59._12_4_ = 0x7fffffff;
    auVar59 = vandps_avx512vl(local_25e8,auVar59);
    auVar57._8_4_ = 0x34000000;
    auVar57._0_8_ = 0x3400000034000000;
    auVar57._12_4_ = 0x34000000;
    auVar57 = vmulps_avx512vl(auVar59,auVar57);
    auVar58 = vminps_avx512vl(local_2608,local_25f8);
    auVar58 = vminps_avx512vl(auVar58,auVar56);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar43 = vxorps_avx512vl(auVar57,auVar43);
    uVar13 = vcmpps_avx512vl(auVar58,auVar43,5);
    auVar58 = vmaxps_avx512vl(local_2608,local_25f8);
    auVar56 = vmaxps_avx512vl(auVar58,auVar56);
    uVar12 = vcmpps_avx512vl(auVar56,auVar57,2);
    bVar18 = ((byte)uVar13 | (byte)uVar12) & 0xf;
    if (bVar18 != 0) {
      auVar57 = vmulps_avx512vl(auVar50,auVar63);
      auVar56 = vmulps_avx512vl(auVar55,auVar48);
      auVar58 = vmulps_avx512vl(auVar44,auVar53);
      auVar43 = vmulps_avx512vl(auVar51,auVar48);
      auVar45 = vmulps_avx512vl(auVar44,auVar52);
      auVar47 = vmulps_avx512vl(auVar49,auVar50);
      auVar53 = vfmsub213ps_avx512vl(auVar53,auVar48,auVar57);
      auVar63 = vfmsub213ps_avx512vl(auVar63,auVar44,auVar56);
      auVar55 = vfmsub213ps_avx512vl(auVar55,auVar50,auVar58);
      auVar50 = vfmsub213ps_avx512vl(auVar52,auVar50,auVar43);
      auVar48 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar45);
      auVar44 = vfmsub213ps_avx512vl(auVar51,auVar44,auVar47);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar57 = vandps_avx512vl(auVar57,auVar49);
      auVar43 = vandps_avx512vl(auVar43,auVar49);
      uVar25 = vcmpps_avx512vl(auVar57,auVar43,1);
      auVar57 = vandps_avx512vl(auVar56,auVar49);
      auVar56 = vandps_avx512vl(auVar45,auVar49);
      uVar29 = vcmpps_avx512vl(auVar57,auVar56,1);
      auVar57 = vandps_avx512vl(auVar58,auVar49);
      auVar56 = vandps_avx512vl(auVar47,auVar49);
      uVar30 = vcmpps_avx512vl(auVar57,auVar56,1);
      bVar40 = (bool)((byte)uVar25 & 1);
      local_2598._0_4_ = (uint)bVar40 * auVar53._0_4_ | (uint)!bVar40 * auVar50._0_4_;
      bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
      local_2598._4_4_ = (uint)bVar40 * auVar53._4_4_ | (uint)!bVar40 * auVar50._4_4_;
      bVar40 = (bool)((byte)(uVar25 >> 2) & 1);
      local_2598._8_4_ = (uint)bVar40 * auVar53._8_4_ | (uint)!bVar40 * auVar50._8_4_;
      bVar40 = (bool)((byte)(uVar25 >> 3) & 1);
      local_2598._12_4_ = (uint)bVar40 * auVar53._12_4_ | (uint)!bVar40 * auVar50._12_4_;
      bVar40 = (bool)((byte)uVar29 & 1);
      local_2588._0_4_ = (uint)bVar40 * auVar63._0_4_ | (uint)!bVar40 * auVar48._0_4_;
      bVar40 = (bool)((byte)(uVar29 >> 1) & 1);
      local_2588._4_4_ = (uint)bVar40 * auVar63._4_4_ | (uint)!bVar40 * auVar48._4_4_;
      bVar40 = (bool)((byte)(uVar29 >> 2) & 1);
      local_2588._8_4_ = (uint)bVar40 * auVar63._8_4_ | (uint)!bVar40 * auVar48._8_4_;
      bVar40 = (bool)((byte)(uVar29 >> 3) & 1);
      local_2588._12_4_ = (uint)bVar40 * auVar63._12_4_ | (uint)!bVar40 * auVar48._12_4_;
      bVar40 = (bool)((byte)uVar30 & 1);
      local_2578[0] = (float)((uint)bVar40 * auVar55._0_4_ | (uint)!bVar40 * auVar44._0_4_);
      bVar40 = (bool)((byte)(uVar30 >> 1) & 1);
      local_2578[1] = (float)((uint)bVar40 * auVar55._4_4_ | (uint)!bVar40 * auVar44._4_4_);
      bVar40 = (bool)((byte)(uVar30 >> 2) & 1);
      local_2578[2] = (float)((uint)bVar40 * auVar55._8_4_ | (uint)!bVar40 * auVar44._8_4_);
      bVar40 = (bool)((byte)(uVar30 >> 3) & 1);
      local_2578[3] = (float)((uint)bVar40 * auVar55._12_4_ | (uint)!bVar40 * auVar44._12_4_);
      auVar44._0_4_ = fVar89 * local_2578[0];
      auVar44._4_4_ = fVar89 * local_2578[1];
      auVar44._8_4_ = fVar89 * local_2578[2];
      auVar44._12_4_ = fVar89 * local_2578[3];
      auVar63 = vfmadd213ps_fma(auVar79,local_2588,auVar44);
      auVar63 = vfmadd213ps_fma(auVar78,local_2598,auVar63);
      auVar56._0_4_ = auVar63._0_4_ + auVar63._0_4_;
      auVar56._4_4_ = auVar63._4_4_ + auVar63._4_4_;
      auVar56._8_4_ = auVar63._8_4_ + auVar63._8_4_;
      auVar56._12_4_ = auVar63._12_4_ + auVar63._12_4_;
      auVar55._0_4_ = auVar46._0_4_ * local_2578[0];
      auVar55._4_4_ = auVar46._4_4_ * local_2578[1];
      auVar55._8_4_ = auVar46._8_4_ * local_2578[2];
      auVar55._12_4_ = auVar46._12_4_ * local_2578[3];
      auVar63 = vfmadd213ps_fma(auVar54,local_2588,auVar55);
      auVar57 = vfmadd213ps_fma(auVar42,local_2598,auVar63);
      auVar42 = vrcp14ps_avx512vl(auVar56);
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = 0x3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar63 = vfnmadd213ps_avx512vl(auVar42,auVar56,auVar63);
      auVar63 = vfmadd132ps_fma(auVar63,auVar42,auVar42);
      uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar53._4_4_ = uVar80;
      auVar53._0_4_ = uVar80;
      auVar53._8_4_ = uVar80;
      auVar53._12_4_ = uVar80;
      auVar110 = ZEXT1664(auVar53);
      local_25a8._0_4_ = auVar63._0_4_ * (auVar57._0_4_ + auVar57._0_4_);
      local_25a8._4_4_ = auVar63._4_4_ * (auVar57._4_4_ + auVar57._4_4_);
      local_25a8._8_4_ = auVar63._8_4_ * (auVar57._8_4_ + auVar57._8_4_);
      local_25a8._12_4_ = auVar63._12_4_ * (auVar57._12_4_ + auVar57._12_4_);
      auVar73 = ZEXT1664(local_25a8);
      uVar13 = vcmpps_avx512vl(local_25a8,auVar53,2);
      uVar80 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar42._4_4_ = uVar80;
      auVar42._0_4_ = uVar80;
      auVar42._8_4_ = uVar80;
      auVar42._12_4_ = uVar80;
      uVar12 = vcmpps_avx512vl(local_25a8,auVar42,0xd);
      bVar18 = (byte)uVar13 & (byte)uVar12 & bVar18;
      if (bVar18 != 0) {
        uVar13 = vcmpps_avx512vl(auVar56,_DAT_01f45a50,4);
        bVar18 = bVar18 & (byte)uVar13;
        if (bVar18 != 0) {
          local_25d8 = &mapUV;
          local_25d0 = bVar18;
          auVar54._8_4_ = 0x219392ef;
          auVar54._0_8_ = 0x219392ef219392ef;
          auVar54._12_4_ = 0x219392ef;
          uVar25 = vcmpps_avx512vl(auVar59,auVar54,5);
          auVar59 = vrcp14ps_avx512vl(local_25e8);
          auVar49._8_4_ = 0x3f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._12_4_ = 0x3f800000;
          auVar63 = vfnmadd213ps_fma(local_25e8,auVar59,auVar49);
          auVar63 = vfmadd132ps_avx512vl(auVar63,auVar59,auVar59);
          fVar89 = (float)((uint)((byte)uVar25 & 1) * auVar63._0_4_);
          fVar81 = (float)((uint)((byte)(uVar25 >> 1) & 1) * auVar63._4_4_);
          fVar103 = (float)((uint)((byte)(uVar25 >> 2) & 1) * auVar63._8_4_);
          fVar96 = (float)((uint)((byte)(uVar25 >> 3) & 1) * auVar63._12_4_);
          auVar47._0_4_ = fVar89 * local_2608._0_4_;
          auVar47._4_4_ = fVar81 * local_2608._4_4_;
          auVar47._8_4_ = fVar103 * local_2608._8_4_;
          auVar47._12_4_ = fVar96 * local_2608._12_4_;
          local_25c8 = vminps_avx(auVar47,auVar49);
          auVar50._0_4_ = fVar89 * local_25f8._0_4_;
          auVar50._4_4_ = fVar81 * local_25f8._4_4_;
          auVar50._8_4_ = fVar103 * local_25f8._8_4_;
          auVar50._12_4_ = fVar96 * local_25f8._12_4_;
          local_25b8 = vminps_avx(auVar50,auVar49);
          auVar48._8_4_ = 0x7f800000;
          auVar48._0_8_ = 0x7f8000007f800000;
          auVar48._12_4_ = 0x7f800000;
          auVar63 = vblendmps_avx512vl(auVar48,local_25a8);
          auVar46._0_4_ =
               (uint)(bVar18 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
          bVar40 = (bool)(bVar18 >> 1 & 1);
          auVar46._4_4_ = (uint)bVar40 * auVar63._4_4_ | (uint)!bVar40 * 0x7f800000;
          bVar40 = (bool)(bVar18 >> 2 & 1);
          auVar46._8_4_ = (uint)bVar40 * auVar63._8_4_ | (uint)!bVar40 * 0x7f800000;
          auVar46._12_4_ =
               (uint)(bVar18 >> 3) * auVar63._12_4_ | (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
          auVar63 = vshufps_avx(auVar46,auVar46,0xb1);
          auVar63 = vminps_avx(auVar63,auVar46);
          auVar59 = vshufpd_avx(auVar63,auVar63,1);
          auVar63 = vminps_avx(auVar59,auVar63);
          uVar13 = vcmpps_avx512vl(auVar46,auVar63,0);
          bVar22 = (byte)uVar13 & bVar18;
          do {
            bVar21 = bVar18;
            if (bVar22 != 0) {
              bVar21 = bVar22;
            }
            uVar14 = 0;
            for (uVar23 = (uint)bVar21; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
              uVar14 = uVar14 + 1;
            }
            uVar23 = *(uint *)((long)&local_24b8 + (ulong)uVar14 * 4);
            pGVar4 = (local_2650->geometries).items[uVar23].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar18 = ~(byte)(1 << (uVar14 & 0x1f)) & bVar18;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar25 = (ulong)(uVar14 << 2);
                uVar80 = *(undefined4 *)(local_25c8 + uVar25);
                uVar3 = *(undefined4 *)(local_25b8 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a8 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2598 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2588 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2578 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar80;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2618 + uVar25);
                *(uint *)(ray + k * 4 + 0x120) = uVar23;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              uVar25 = (ulong)(uVar14 * 4);
              uVar80 = *(undefined4 *)(local_25c8 + uVar25);
              local_2478._4_4_ = uVar80;
              local_2478._0_4_ = uVar80;
              local_2478._8_4_ = uVar80;
              local_2478._12_4_ = uVar80;
              local_2468 = *(undefined4 *)(local_25b8 + uVar25);
              local_2448 = vpbroadcastd_avx512vl();
              uVar80 = *(undefined4 *)((long)&local_2618 + uVar25);
              local_2458._4_4_ = uVar80;
              local_2458._0_4_ = uVar80;
              local_2458._8_4_ = uVar80;
              local_2458._12_4_ = uVar80;
              uVar80 = *(undefined4 *)(local_2598 + uVar25);
              uVar3 = *(undefined4 *)(local_2588 + uVar25);
              local_2498._4_4_ = uVar3;
              local_2498._0_4_ = uVar3;
              local_2498._8_4_ = uVar3;
              local_2498._12_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)local_2578 + uVar25);
              local_2488._4_4_ = uVar3;
              local_2488._0_4_ = uVar3;
              local_2488._8_4_ = uVar3;
              local_2488._12_4_ = uVar3;
              local_24a8[0] = (RTCHitN)(char)uVar80;
              local_24a8[1] = (RTCHitN)(char)((uint)uVar80 >> 8);
              local_24a8[2] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
              local_24a8[3] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
              local_24a8[4] = (RTCHitN)(char)uVar80;
              local_24a8[5] = (RTCHitN)(char)((uint)uVar80 >> 8);
              local_24a8[6] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
              local_24a8[7] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
              local_24a8[8] = (RTCHitN)(char)uVar80;
              local_24a8[9] = (RTCHitN)(char)((uint)uVar80 >> 8);
              local_24a8[10] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
              local_24a8[0xb] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
              local_24a8[0xc] = (RTCHitN)(char)uVar80;
              local_24a8[0xd] = (RTCHitN)(char)((uint)uVar80 >> 8);
              local_24a8[0xe] = (RTCHitN)(char)((uint)uVar80 >> 0x10);
              local_24a8[0xf] = (RTCHitN)(char)((uint)uVar80 >> 0x18);
              uStack_2464 = local_2468;
              uStack_2460 = local_2468;
              uStack_245c = local_2468;
              vpcmpeqd_avx2(ZEXT1632(local_2478),ZEXT1632(local_2478));
              uStack_2434 = context->user->instID[0];
              local_2438 = uStack_2434;
              uStack_2430 = uStack_2434;
              uStack_242c = uStack_2434;
              uStack_2428 = context->user->instPrimID[0];
              uStack_2424 = uStack_2428;
              uStack_2420 = uStack_2428;
              uStack_241c = uStack_2428;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a8 + uVar25);
              local_2688 = local_24c8;
              args.valid = (int *)local_2688;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_24a8;
              args.N = 4;
              auVar63 = auVar73._0_16_;
              auVar59 = auVar110._0_16_;
              args.ray = (RTCRayN *)ray;
              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->intersectionFilterN)(&args);
                auVar110 = ZEXT1664(auVar59);
                auVar73 = ZEXT1664(auVar63);
                auVar117 = ZEXT3264(local_2568);
                auVar116 = ZEXT3264(local_2548);
                auVar115 = ZEXT3264(local_2528);
                auVar114 = ZEXT3264(local_2508);
                auVar113 = ZEXT3264(local_24e8);
              }
              uVar25 = vptestmd_avx512vl(local_2688,local_2688);
              if ((uVar25 & 0xf) == 0) {
LAB_01da2a8f:
                *(int *)(ray + k * 4 + 0x80) = auVar110._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar110 = ZEXT1664(auVar59);
                  auVar73 = ZEXT1664(auVar63);
                  auVar117 = ZEXT3264(local_2568);
                  auVar116 = ZEXT3264(local_2548);
                  auVar115 = ZEXT3264(local_2528);
                  auVar114 = ZEXT3264(local_2508);
                  auVar113 = ZEXT3264(local_24e8);
                }
                uVar25 = vptestmd_avx512vl(local_2688,local_2688);
                uVar25 = uVar25 & 0xf;
                bVar22 = (byte)uVar25;
                if (bVar22 == 0) goto LAB_01da2a8f;
                iVar2 = *(int *)(args.hit + 4);
                iVar15 = *(int *)(args.hit + 8);
                iVar16 = *(int *)(args.hit + 0xc);
                bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                bVar7 = SUB81(uVar25 >> 3,0);
                *(uint *)(args.ray + 0xc0) =
                     (uint)(bVar22 & 1) * *(int *)args.hit |
                     (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xc0);
                *(uint *)(args.ray + 0xc4) =
                     (uint)bVar40 * iVar2 | (uint)!bVar40 * *(int *)(args.ray + 0xc4);
                *(uint *)(args.ray + 200) =
                     (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 200);
                *(uint *)(args.ray + 0xcc) =
                     (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xcc);
                iVar2 = *(int *)(args.hit + 0x14);
                iVar15 = *(int *)(args.hit + 0x18);
                iVar16 = *(int *)(args.hit + 0x1c);
                bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                bVar7 = SUB81(uVar25 >> 3,0);
                *(uint *)(args.ray + 0xd0) =
                     (uint)(bVar22 & 1) * *(int *)(args.hit + 0x10) |
                     (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xd0);
                *(uint *)(args.ray + 0xd4) =
                     (uint)bVar40 * iVar2 | (uint)!bVar40 * *(int *)(args.ray + 0xd4);
                *(uint *)(args.ray + 0xd8) =
                     (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xd8);
                *(uint *)(args.ray + 0xdc) =
                     (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xdc);
                iVar2 = *(int *)(args.hit + 0x24);
                iVar15 = *(int *)(args.hit + 0x28);
                iVar16 = *(int *)(args.hit + 0x2c);
                bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                bVar7 = SUB81(uVar25 >> 3,0);
                *(uint *)(args.ray + 0xe0) =
                     (uint)(bVar22 & 1) * *(int *)(args.hit + 0x20) |
                     (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xe0);
                *(uint *)(args.ray + 0xe4) =
                     (uint)bVar40 * iVar2 | (uint)!bVar40 * *(int *)(args.ray + 0xe4);
                *(uint *)(args.ray + 0xe8) =
                     (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xe8);
                *(uint *)(args.ray + 0xec) =
                     (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xec);
                iVar2 = *(int *)(args.hit + 0x34);
                iVar15 = *(int *)(args.hit + 0x38);
                iVar16 = *(int *)(args.hit + 0x3c);
                bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                bVar7 = SUB81(uVar25 >> 3,0);
                *(uint *)(args.ray + 0xf0) =
                     (uint)(bVar22 & 1) * *(int *)(args.hit + 0x30) |
                     (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xf0);
                *(uint *)(args.ray + 0xf4) =
                     (uint)bVar40 * iVar2 | (uint)!bVar40 * *(int *)(args.ray + 0xf4);
                *(uint *)(args.ray + 0xf8) =
                     (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xf8);
                *(uint *)(args.ray + 0xfc) =
                     (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xfc);
                auVar63 = *(undefined1 (*) [16])(args.ray + 0x100);
                auVar51._0_4_ =
                     (uint)(bVar22 & 1) * *(int *)(args.hit + 0x40) |
                     (uint)!(bool)(bVar22 & 1) * auVar63._0_4_;
                bVar40 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar51._4_4_ =
                     (uint)bVar40 * *(int *)(args.hit + 0x44) | (uint)!bVar40 * auVar63._4_4_;
                bVar40 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar51._8_4_ =
                     (uint)bVar40 * *(int *)(args.hit + 0x48) | (uint)!bVar40 * auVar63._8_4_;
                bVar40 = SUB81(uVar25 >> 3,0);
                auVar51._12_4_ =
                     (uint)bVar40 * *(int *)(args.hit + 0x4c) | (uint)!bVar40 * auVar63._12_4_;
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar51;
                auVar63 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar63;
                auVar63 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar63;
                auVar63 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar63;
                auVar63 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar63;
                auVar110 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar80 = auVar110._0_4_;
              auVar52._4_4_ = uVar80;
              auVar52._0_4_ = uVar80;
              auVar52._8_4_ = uVar80;
              auVar52._12_4_ = uVar80;
              uVar13 = vcmpps_avx512vl(auVar73._0_16_,auVar52,2);
              bVar18 = ~(byte)(1 << (uVar14 & 0x1f)) & bVar18 & (byte)uVar13;
            }
            if (bVar18 == 0) break;
            auVar72._8_4_ = 0x7f800000;
            auVar72._0_8_ = 0x7f8000007f800000;
            auVar72._12_4_ = 0x7f800000;
            auVar63 = vblendmps_avx512vl(auVar72,auVar73._0_16_);
            auVar61._0_4_ =
                 (uint)(bVar18 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
            bVar40 = (bool)(bVar18 >> 1 & 1);
            auVar61._4_4_ = (uint)bVar40 * auVar63._4_4_ | (uint)!bVar40 * 0x7f800000;
            bVar40 = (bool)(bVar18 >> 2 & 1);
            auVar61._8_4_ = (uint)bVar40 * auVar63._8_4_ | (uint)!bVar40 * 0x7f800000;
            auVar61._12_4_ =
                 (uint)(bVar18 >> 3) * auVar63._12_4_ | (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
            auVar63 = vshufps_avx(auVar61,auVar61,0xb1);
            auVar63 = vminps_avx(auVar63,auVar61);
            auVar59 = vshufpd_avx(auVar63,auVar63,1);
            auVar63 = vminps_avx(auVar59,auVar63);
            uVar13 = vcmpps_avx512vl(auVar61,auVar63,0);
            bVar22 = (byte)uVar13 & bVar18;
          } while( true );
        }
      }
    }
    auVar110 = ZEXT3264(local_2418);
    uVar25 = local_2670;
    fVar81 = local_2398;
    fVar83 = fStack_2394;
    fVar84 = fStack_2390;
    fVar85 = fStack_238c;
    fVar86 = fStack_2388;
    fVar87 = fStack_2384;
    fVar88 = fStack_2380;
    fVar89 = local_23b8;
    fVar90 = fStack_23b4;
    fVar91 = fStack_23b0;
    fVar92 = fStack_23ac;
    fVar93 = fStack_23a8;
    fVar94 = fStack_23a4;
    fVar95 = fStack_23a0;
    fVar96 = local_23d8;
    fVar97 = fStack_23d4;
    fVar98 = fStack_23d0;
    fVar99 = fStack_23cc;
    fVar100 = fStack_23c8;
    fVar101 = fStack_23c4;
    fVar102 = fStack_23c0;
    fVar103 = local_23f8;
    fVar104 = fStack_23f4;
    fVar105 = fStack_23f0;
    fVar106 = fStack_23ec;
    fVar107 = fStack_23e8;
    fVar108 = fStack_23e4;
    fVar109 = fStack_23e0;
  }
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar73 = ZEXT3264(CONCAT428(uVar80,CONCAT424(uVar80,CONCAT420(uVar80,CONCAT416(uVar80,CONCAT412(
                                                  uVar80,CONCAT48(uVar80,CONCAT44(uVar80,uVar80)))))
                                               )));
  auVar64 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar111 = ZEXT3264(auVar64);
  auVar64 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar112 = ZEXT3264(auVar64);
  goto LAB_01da1bb4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }